

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O1

int write_sparse_skip_chunk(output_file *out,int64_t skip_len)

{
  int iVar1;
  chunk_header_t chunk_header;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  if (skip_len % (long)(ulong)out->block_size == 0) {
    local_1c = 0xcac3;
    local_18 = (undefined4)(skip_len / (long)(ulong)out->block_size);
    local_14 = 0xc;
    iVar1 = (*out->ops->write)(out,&local_1c,0xc);
    if (-1 < iVar1) {
      out->cur_out_ptr = out->cur_out_ptr + skip_len;
      out->chunk_cnt = out->chunk_cnt + 1;
      return 0;
    }
  }
  else {
    fprintf(_stderr,"error: %s: don\'t care size %li is not a multiple of the block size %u\n",
            "write_sparse_skip_chunk",skip_len);
  }
  return -1;
}

Assistant:

static int write_sparse_skip_chunk(struct output_file* out, int64_t skip_len) {
  chunk_header_t chunk_header;
  int ret;

  if (skip_len % out->block_size) {
    error("don't care size %" PRIi64 " is not a multiple of the block size %u", skip_len,
          out->block_size);
    return -1;
  }

  /* We are skipping data, so emit a don't care chunk. */
  chunk_header.chunk_type = CHUNK_TYPE_DONT_CARE;
  chunk_header.reserved1 = 0;
  chunk_header.chunk_sz = skip_len / out->block_size;
  chunk_header.total_sz = CHUNK_HEADER_LEN;
  ret = out->ops->write(out, &chunk_header, sizeof(chunk_header));
  if (ret < 0) return -1;

  out->cur_out_ptr += skip_len;
  out->chunk_cnt++;

  return 0;
}